

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O0

bool __thiscall spvtools::opt::SSAPropagator::Simulate(SSAPropagator *this,Instruction *instr)

{
  uint uVar1;
  uint uVar2;
  Instruction *this_00;
  bool bVar3;
  Op OVar4;
  uint32_t uVar5;
  mapped_type *this_01;
  BasicBlock *b1;
  DefUseManager *this_02;
  anon_class_8_1_8991fb9c local_b0;
  function<bool_(unsigned_int_*)> local_a8;
  Instruction *local_88;
  Instruction *arg_def_instr;
  uint local_78;
  uint32_t arg_id;
  uint32_t i;
  bool has_operands_to_simulate;
  reference local_60;
  Edge *e;
  iterator __end4;
  iterator __begin4;
  mapped_type *__range4;
  BasicBlock *block;
  bool status_changed;
  BasicBlock *pBStack_30;
  PropStatus status;
  BasicBlock *dest_bb;
  Instruction *pIStack_20;
  bool changed;
  Instruction *instr_local;
  SSAPropagator *this_local;
  
  dest_bb._7_1_ = 0;
  pIStack_20 = instr;
  instr_local = (Instruction *)this;
  bVar3 = ShouldSimulateAgain(this,instr);
  if (bVar3) {
    pBStack_30 = (BasicBlock *)0x0;
    block._4_4_ = std::
                  function<spvtools::opt::SSAPropagator::PropStatus_(spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_**)>
                  ::operator()(&this->visit_fn_,pIStack_20,&stack0xffffffffffffffd0);
    block._3_1_ = SetStatus(this,pIStack_20,block._4_4_);
    if (block._4_4_ == kVarying) {
      DontSimulateAgain(this,pIStack_20);
      if ((block._3_1_ & 1) != 0) {
        AddSSAEdges(this,pIStack_20);
      }
      bVar3 = Instruction::IsBlockTerminator(pIStack_20);
      if (bVar3) {
        __range4 = (mapped_type *)IRContext::get_instr_block(this->ctx_,pIStack_20);
        this_01 = std::
                  unordered_map<spvtools::opt::BasicBlock_*,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>_>_>
                  ::at(&this->bb_succs_,(key_type *)&__range4);
        __end4 = std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>::begin
                           (this_01);
        e = (Edge *)std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>::end
                              (this_01);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<spvtools::opt::Edge_*,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>
                                           *)&e), bVar3) {
          local_60 = __gnu_cxx::
                     __normal_iterator<spvtools::opt::Edge_*,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>
                     ::operator*(&__end4);
          AddControlEdge(this,local_60);
          __gnu_cxx::
          __normal_iterator<spvtools::opt::Edge_*,_std::vector<spvtools::opt::Edge,_std::allocator<spvtools::opt::Edge>_>_>
          ::operator++(&__end4);
        }
      }
      this_local._7_1_ = false;
    }
    else {
      if (block._4_4_ == kInteresting) {
        if ((bool)block._3_1_) {
          AddSSAEdges(this,pIStack_20);
        }
        if (pBStack_30 != (BasicBlock *)0x0) {
          b1 = IRContext::get_instr_block(this->ctx_,pIStack_20);
          Edge::Edge((Edge *)&i,b1,pBStack_30);
          AddControlEdge(this,(Edge *)&i);
        }
        dest_bb._7_1_ = 1;
      }
      arg_id._3_1_ = 0;
      OVar4 = Instruction::opcode(pIStack_20);
      this_00 = pIStack_20;
      if (OVar4 == OpPhi) {
        for (local_78 = 2; uVar1 = local_78, uVar5 = Instruction::NumOperands(pIStack_20),
            uVar2 = local_78, uVar1 < uVar5; local_78 = local_78 + 2) {
          bVar3 = false;
          if ((local_78 & 1) == 0) {
            uVar5 = Instruction::NumOperands(pIStack_20);
            bVar3 = false;
            if (uVar2 < uVar5 - 1) {
              bVar3 = true;
            }
          }
          if (!bVar3) {
            __assert_fail("i % 2 == 0 && i < instr->NumOperands() - 1 && \"malformed Phi arguments\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/propagator.cpp"
                          ,0x91,"bool spvtools::opt::SSAPropagator::Simulate(Instruction *)");
          }
          arg_def_instr._4_4_ = Instruction::GetSingleWordOperand(pIStack_20,local_78);
          this_02 = get_def_use_mgr(this);
          local_88 = analysis::DefUseManager::GetDef(this_02,arg_def_instr._4_4_);
          bVar3 = IsPhiArgExecutable(this,pIStack_20,local_78);
          if ((!bVar3) || (bVar3 = ShouldSimulateAgain(this,local_88), bVar3)) {
            arg_id._3_1_ = 1;
            break;
          }
        }
      }
      else {
        local_b0.this = this;
        std::function<bool(unsigned_int*)>::
        function<spvtools::opt::SSAPropagator::Simulate(spvtools::opt::Instruction*)::__0,void>
                  ((function<bool(unsigned_int*)> *)&local_a8,&local_b0);
        bVar3 = Instruction::WhileEachInId(this_00,&local_a8);
        arg_id._3_1_ = (bVar3 ^ 0xffU) & 1;
        std::function<bool_(unsigned_int_*)>::~function(&local_a8);
      }
      if ((arg_id._3_1_ & 1) == 0) {
        DontSimulateAgain(this,pIStack_20);
      }
      this_local._7_1_ = (bool)(dest_bb._7_1_ & 1);
    }
  }
  else {
    this_local._7_1_ = (bool)(dest_bb._7_1_ & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool SSAPropagator::Simulate(Instruction* instr) {
  bool changed = false;

  // Don't bother visiting instructions that should not be simulated again.
  if (!ShouldSimulateAgain(instr)) {
    return changed;
  }

  BasicBlock* dest_bb = nullptr;
  PropStatus status = visit_fn_(instr, &dest_bb);
  bool status_changed = SetStatus(instr, status);

  if (status == kVarying) {
    // The statement produces a varying result, add it to the list of statements
    // not to simulate anymore and add its SSA def-use edges for simulation.
    DontSimulateAgain(instr);
    if (status_changed) {
      AddSSAEdges(instr);
    }

    // If |instr| is a block terminator, add all the control edges out of its
    // block.
    if (instr->IsBlockTerminator()) {
      BasicBlock* block = ctx_->get_instr_block(instr);
      for (const auto& e : bb_succs_.at(block)) {
        AddControlEdge(e);
      }
    }
    return false;
  } else if (status == kInteresting) {
    // Add the SSA edges coming out of this instruction if the propagation
    // status has changed.
    if (status_changed) {
      AddSSAEdges(instr);
    }

    // If there are multiple outgoing control flow edges and we know which one
    // will be taken, add the destination block to the CFG work list.
    if (dest_bb) {
      AddControlEdge(Edge(ctx_->get_instr_block(instr), dest_bb));
    }
    changed = true;
  }

  // At this point, we are dealing with instructions that are in status
  // kInteresting or kNotInteresting.  To decide whether this instruction should
  // be simulated again, we examine its operands.  If at least one operand O is
  // defined at an instruction D that should be simulated again, then the output
  // of D might affect |instr|, so we should simulate |instr| again.
  bool has_operands_to_simulate = false;
  if (instr->opcode() == spv::Op::OpPhi) {
    // For Phi instructions, an operand causes the Phi to be simulated again if
    // the operand comes from an edge that has not yet been traversed or if its
    // definition should be simulated again.
    for (uint32_t i = 2; i < instr->NumOperands(); i += 2) {
      // Phi arguments come in pairs. Index 'i' contains the
      // variable id, index 'i + 1' is the originating block id.
      assert(i % 2 == 0 && i < instr->NumOperands() - 1 &&
             "malformed Phi arguments");

      uint32_t arg_id = instr->GetSingleWordOperand(i);
      Instruction* arg_def_instr = get_def_use_mgr()->GetDef(arg_id);
      if (!IsPhiArgExecutable(instr, i) || ShouldSimulateAgain(arg_def_instr)) {
        has_operands_to_simulate = true;
        break;
      }
    }
  } else {
    // For regular instructions, check if the defining instruction of each
    // operand needs to be simulated again.  If so, then this instruction should
    // also be simulated again.
    has_operands_to_simulate =
        !instr->WhileEachInId([this](const uint32_t* use) {
          Instruction* def_instr = get_def_use_mgr()->GetDef(*use);
          if (ShouldSimulateAgain(def_instr)) {
            return false;
          }
          return true;
        });
  }

  if (!has_operands_to_simulate) {
    DontSimulateAgain(instr);
  }

  return changed;
}